

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConversionExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,ConversionKind *args_1,Expression *args_2,
          SourceRange *args_3)

{
  ConversionKind CVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  ConversionExpression *pCVar4;
  
  pCVar4 = (ConversionExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConversionExpression *)this->endPtr < pCVar4 + 1) {
    pCVar4 = (ConversionExpression *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pCVar4 + 1);
  }
  CVar1 = *args_1;
  SVar2 = args_3->startLoc;
  SVar3 = args_3->endLoc;
  (pCVar4->super_Expression).kind = Conversion;
  (pCVar4->super_Expression).type.ptr = args;
  (pCVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pCVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pCVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pCVar4->super_Expression).sourceRange.endLoc = SVar3;
  pCVar4->conversionKind = CVar1;
  pCVar4->operand_ = args_2;
  (pCVar4->implicitOpRange).startLoc = (SourceLocation)0x0;
  (pCVar4->implicitOpRange).endLoc = (SourceLocation)0x0;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }